

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TreeNodeBehavior(ImGuiID id,ImGuiTreeNodeFlags flags,char *label,char *label_end)

{
  ImDrawList *pIVar1;
  ImVec2 pos;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  ImGuiWindow *pIVar5;
  bool bVar6;
  float _y;
  float fVar7;
  ImGuiCol local_184;
  ImGuiCol local_140;
  byte local_13a;
  bool local_139;
  float local_138;
  float local_130;
  float local_128;
  ImVec2 local_118;
  ImVec2 local_110;
  ImVec2 local_108;
  ImVec2 local_100;
  ImU32 local_f4;
  ImU32 bg_col_1;
  ImVec2 local_e8;
  char local_df [7];
  char log_suffix [3];
  ImVec2 IStack_d8;
  char log_prefix [4];
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImU32 local_b8;
  ImGuiNavHighlightFlags local_b4;
  ImU32 bg_col;
  ImGuiNavHighlightFlags nav_highlight_flags;
  ImU32 text_col;
  bool toggled;
  bool pressed;
  float fStack_a4;
  bool held;
  bool hovered;
  bool was_selected;
  bool selected;
  bool is_mouse_x_over_arrow;
  float arrow_hit_x2;
  float arrow_hit_x1;
  ImGuiButtonFlags button_flags;
  bool item_add;
  bool is_open;
  bool is_leaf;
  ImRect interact_bb;
  ImVec2 local_7c;
  ImVec2 text_pos;
  float text_width;
  float text_offset_y;
  float text_offset_x;
  ImRect frame_bb;
  float frame_height;
  ImVec2 label_size;
  ImVec2 padding;
  bool display_frame;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  char *label_end_local;
  char *label_local;
  ImGuiTreeNodeFlags flags_local;
  ImGuiID id_local;
  
  pIVar5 = GetCurrentWindow();
  pIVar4 = GImGui;
  if ((pIVar5->SkipItems & 1U) == 0) {
    bVar6 = (flags & 2U) != 0;
    if ((bVar6) || ((flags & 0x400U) != 0)) {
      label_size = (GImGui->Style).FramePadding;
    }
    else {
      fVar7 = (GImGui->Style).FramePadding.x;
      _y = ImMin<float>((pIVar5->DC).CurrLineTextBaseOffset,(GImGui->Style).FramePadding.y);
      ImVec2::ImVec2(&label_size,fVar7,_y);
    }
    window = (ImGuiWindow *)label_end;
    if (label_end == (char *)0x0) {
      window = (ImGuiWindow *)FindRenderedTextEnd(label,(char *)0x0);
    }
    register0x00001200 = CalcTextSize(label,(char *)window,false,-1.0);
    fVar7 = (pIVar4->Style).FramePadding.y;
    fVar7 = ImMin<float>((pIVar5->DC).CurrLineSize.y,fVar7 + fVar7 + pIVar4->FontSize);
    frame_bb.Max.x = ImMax<float>(fVar7,label_size.y + label_size.y + frame_height);
    ImRect::ImRect((ImRect *)&text_offset_y);
    if ((flags & 0x1000U) == 0) {
      local_128 = (pIVar5->DC).CursorPos.x;
    }
    else {
      local_128 = (pIVar5->WorkRect).Min.x;
    }
    text_offset_y = local_128;
    text_offset_x = (pIVar5->DC).CursorPos.y;
    frame_bb.Min.x = (pIVar5->WorkRect).Max.x;
    frame_bb.Min.y = (pIVar5->DC).CursorPos.y + frame_bb.Max.x;
    if (bVar6) {
      text_offset_y = local_128 - (float)(int)((pIVar5->WindowPadding).x * 0.5 + -1.0);
      frame_bb.Min.x = (float)(int)((pIVar5->WindowPadding).x * 0.5) + frame_bb.Min.x;
    }
    if (bVar6) {
      local_130 = label_size.x * 3.0;
    }
    else {
      local_130 = label_size.x * 2.0;
    }
    local_130 = pIVar4->FontSize + local_130;
    text_pos.y = ImMax<float>(label_size.y,(pIVar5->DC).CurrLineTextBaseOffset);
    if (frame_bb.Max.y <= 0.0) {
      local_138 = 0.0;
    }
    else {
      local_138 = label_size.x + label_size.x + frame_bb.Max.y;
    }
    text_pos.x = pIVar4->FontSize + local_138;
    ImVec2::ImVec2(&local_7c,(pIVar5->DC).CursorPos.x + local_130,
                   (pIVar5->DC).CursorPos.y + text_pos.y);
    ImVec2::ImVec2(&interact_bb.Max,text_pos.x,frame_bb.Max.x);
    ItemSize(&interact_bb.Max,label_size.y);
    unique0x1000042c = text_offset_x;
    button_flags = text_offset_y;
    interact_bb.Min.y = frame_bb.Min.y;
    interact_bb.Min.x = frame_bb.Min.x;
    if ((!bVar6) && ((flags & 0x1800U) == 0)) {
      fVar7 = (pIVar4->Style).ItemSpacing.x;
      interact_bb.Min.x = fVar7 + fVar7 + text_offset_y + text_pos.x;
    }
    arrow_hit_x1._3_1_ = (flags & 0x100U) != 0;
    arrow_hit_x1._2_1_ = TreeNodeBehaviorIsOpen(id,flags);
    if (((((bool)arrow_hit_x1._2_1_) && ((pIVar4->NavIdIsAlive & 1U) == 0)) &&
        ((flags & 0x2000U) != 0)) && ((flags & 8U) == 0)) {
      (pIVar5->DC).TreeJumpToParentOnPopMask =
           1 << ((byte)(pIVar5->DC).TreeDepth & 0x1f) | (pIVar5->DC).TreeJumpToParentOnPopMask;
    }
    arrow_hit_x1._1_1_ = ItemAdd((ImRect *)&button_flags,id,(ImRect *)0x0);
    (pIVar5->DC).LastItemStatusFlags = (pIVar5->DC).LastItemStatusFlags | 2;
    IVar2.y = text_offset_x;
    IVar2.x = text_offset_y;
    (pIVar5->DC).LastItemDisplayRect.Min = IVar2;
    IVar3.y = frame_bb.Min.y;
    IVar3.x = frame_bb.Min.x;
    (pIVar5->DC).LastItemDisplayRect.Max = IVar3;
    if ((bool)arrow_hit_x1._1_1_) {
      arrow_hit_x2 = 0.0;
      if ((flags & 4U) != 0) {
        arrow_hit_x2 = 5.73972e-42;
      }
      if ((arrow_hit_x1._3_1_ & 1) == 0) {
        arrow_hit_x2 = (float)((uint)arrow_hit_x2 | 0x200);
      }
      _hovered = (local_7c.x - local_130) - (pIVar4->Style).TouchExtraPadding.x;
      fStack_a4 = (local_7c.x - local_130) + label_size.x + label_size.x + pIVar4->FontSize +
                  (pIVar4->Style).TouchExtraPadding.x;
      local_139 = false;
      if (_hovered <= (pIVar4->IO).MousePos.x) {
        local_139 = (pIVar4->IO).MousePos.x < fStack_a4;
      }
      text_col._3_1_ = local_139;
      if ((pIVar5 != pIVar4->HoveredWindow) || (local_139 == false)) {
        arrow_hit_x2 = (float)((uint)arrow_hit_x2 | 0x10000);
      }
      if (local_139 == false) {
        if ((flags & 0x40U) == 0) {
          arrow_hit_x2 = (float)((uint)arrow_hit_x2 | 0x20);
        }
        else {
          arrow_hit_x2 = (float)((uint)arrow_hit_x2 | 0x120);
        }
      }
      else {
        arrow_hit_x2 = (float)((uint)arrow_hit_x2 | 0x10);
      }
      text_col._1_1_ = (flags & 1U) != 0;
      text_col._2_1_ = text_col._1_1_;
      nav_highlight_flags._2_1_ =
           ButtonBehavior((ImRect *)&button_flags,id,(bool *)&text_col,
                          (bool *)((long)&nav_highlight_flags + 3),(ImGuiButtonFlags)arrow_hit_x2);
      nav_highlight_flags._1_1_ = false;
      if ((arrow_hit_x1._3_1_ & 1) == 0) {
        if (((bool)nav_highlight_flags._2_1_) && (pIVar4->DragDropHoldJustPressedId != id)) {
          if (((flags & 0xc0U) == 0) || (pIVar4->NavActivateId == id)) {
            nav_highlight_flags._1_1_ = true;
          }
          if ((flags & 0x80U) != 0) {
            local_13a = 0;
            if ((text_col._3_1_ & 1) != 0) {
              local_13a = pIVar4->NavDisableMouseHover ^ 0xff;
            }
            nav_highlight_flags._1_1_ =
                 (bool)nav_highlight_flags._1_1_ != false || (local_13a & 1) != 0;
          }
          if (((flags & 0x40U) != 0) && (((pIVar4->IO).MouseDoubleClicked[0] & 1U) != 0)) {
            nav_highlight_flags._1_1_ = true;
          }
        }
        else if (((bool)nav_highlight_flags._2_1_) && (pIVar4->DragDropHoldJustPressedId == id)) {
          if (((uint)arrow_hit_x2 & 0x200) == 0) {
            __assert_fail("button_flags & ImGuiButtonFlags_PressedOnDragDropHold",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                          ,0x166c,
                          "bool ImGui::TreeNodeBehavior(ImGuiID, ImGuiTreeNodeFlags, const char *, const char *)"
                         );
          }
          nav_highlight_flags._1_1_ = (arrow_hit_x1._2_1_ & 1) == 0;
        }
        if ((((pIVar4->NavId == id) && ((pIVar4->NavMoveRequest & 1U) != 0)) &&
            (pIVar4->NavMoveDir == 0)) && ((arrow_hit_x1._2_1_ & 1) != 0)) {
          nav_highlight_flags._1_1_ = 1;
          NavMoveRequestCancel();
        }
        if (((pIVar4->NavId == id) && ((pIVar4->NavMoveRequest & 1U) != 0)) &&
           ((pIVar4->NavMoveDir == 1 && ((arrow_hit_x1._2_1_ & 1) == 0)))) {
          nav_highlight_flags._1_1_ = 1;
          NavMoveRequestCancel();
        }
        if ((nav_highlight_flags._1_1_ & 1) != 0) {
          arrow_hit_x1._2_1_ = (arrow_hit_x1._2_1_ ^ 0xff) & 1;
          ImGuiStorage::SetInt((pIVar5->DC).StateStorage,id,(uint)arrow_hit_x1._2_1_);
          (pIVar5->DC).LastItemStatusFlags = (pIVar5->DC).LastItemStatusFlags | 0x10;
        }
      }
      if ((flags & 4U) != 0) {
        SetItemAllowOverlap();
      }
      if ((text_col._2_1_ & 1) != (text_col._1_1_ & 1)) {
        (pIVar5->DC).LastItemStatusFlags = (pIVar5->DC).LastItemStatusFlags | 8;
      }
      bg_col = GetColorU32(0,1.0);
      local_b4 = 2;
      if (bVar6) {
        if (((nav_highlight_flags._3_1_ & 1) == 0) || (((byte)text_col & 1) == 0)) {
          local_140 = 0x18;
          if (((byte)text_col & 1) != 0) {
            local_140 = 0x19;
          }
        }
        else {
          local_140 = 0x1a;
        }
        local_b8 = GetColorU32(local_140,1.0);
        local_c0.y = text_offset_x;
        local_c0.x = text_offset_y;
        local_c8.y = frame_bb.Min.y;
        local_c8.x = frame_bb.Min.x;
        RenderFrame(local_c0,local_c8,local_b8,true,(pIVar4->Style).FrameRounding);
        RenderNavHighlight((ImRect *)&text_offset_y,id,local_b4);
        if ((flags & 0x200U) == 0) {
          if ((arrow_hit_x1._3_1_ & 1) == 0) {
            pIVar1 = pIVar5->DrawList;
            ImVec2::ImVec2(&stack0xffffffffffffff28,(local_7c.x - local_130) + label_size.x,
                           local_7c.y);
            RenderArrow(pIVar1,IStack_d8,bg_col,(arrow_hit_x1._2_1_ & 1) * 2 + 1,1.0);
          }
          else {
            local_7c.x = local_7c.x - local_130;
          }
        }
        else {
          pIVar1 = pIVar5->DrawList;
          ImVec2::ImVec2(&local_d0,local_7c.x + local_130 * -0.6,pIVar4->FontSize * 0.5 + local_7c.y
                        );
          RenderBullet(pIVar1,local_d0,bg_col);
        }
        if ((flags & 0x100000U) != 0) {
          frame_bb.Min.x = frame_bb.Min.x - (pIVar4->FontSize + (pIVar4->Style).FramePadding.x);
        }
        if ((pIVar4->LogEnabled & 1U) == 0) {
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff10,0.0,0.0);
          RenderTextClipped(&local_7c,&frame_bb.Min,label,(char *)window,(ImVec2 *)&frame_bb.Max.y,
                            (ImVec2 *)&stack0xffffffffffffff10,(ImRect *)0x0);
        }
        else {
          local_df[3] = '\n';
          local_df[4] = '#';
          local_df[5] = '#';
          local_df[6] = '\0';
          local_df[0] = '#';
          local_df[1] = '#';
          local_df[2] = 0;
          LogRenderedText(&local_7c,local_df + 3,local_df + 6);
          ImVec2::ImVec2(&local_e8,0.0,0.0);
          RenderTextClipped(&local_7c,&frame_bb.Min,label,(char *)window,(ImVec2 *)&frame_bb.Max.y,
                            &local_e8,(ImRect *)0x0);
          LogRenderedText(&local_7c,local_df,local_df + 2);
        }
      }
      else {
        if ((((byte)text_col & 1) != 0) || ((text_col._2_1_ & 1) != 0)) {
          if (((nav_highlight_flags._3_1_ & 1) == 0) || (((byte)text_col & 1) == 0)) {
            local_184 = 0x18;
            if (((byte)text_col & 1) != 0) {
              local_184 = 0x19;
            }
          }
          else {
            local_184 = 0x1a;
          }
          local_f4 = GetColorU32(local_184,1.0);
          local_100.y = text_offset_x;
          local_100.x = text_offset_y;
          local_108.y = frame_bb.Min.y;
          local_108.x = frame_bb.Min.x;
          RenderFrame(local_100,local_108,local_f4,false,0.0);
          RenderNavHighlight((ImRect *)&text_offset_y,id,local_b4);
        }
        if ((flags & 0x200U) == 0) {
          if ((arrow_hit_x1._3_1_ & 1) == 0) {
            pIVar1 = pIVar5->DrawList;
            ImVec2::ImVec2(&local_118,(local_7c.x - local_130) + label_size.x,
                           pIVar4->FontSize * 0.15 + local_7c.y);
            RenderArrow(pIVar1,local_118,bg_col,(arrow_hit_x1._2_1_ & 1) * 2 + 1,0.7);
          }
        }
        else {
          pIVar1 = pIVar5->DrawList;
          ImVec2::ImVec2(&local_110,local_7c.x - local_130 * 0.5,pIVar4->FontSize * 0.5 + local_7c.y
                        );
          RenderBullet(pIVar1,local_110,bg_col);
        }
        if ((pIVar4->LogEnabled & 1U) != 0) {
          LogRenderedText(&local_7c,">",(char *)0x0);
        }
        pos.y = local_7c.y;
        pos.x = local_7c.x;
        RenderText(pos,label,(char *)window,false);
      }
      if (((arrow_hit_x1._2_1_ & 1) != 0) && ((flags & 8U) == 0)) {
        TreePushOverrideID(id);
      }
      flags_local._3_1_ = (bool)(arrow_hit_x1._2_1_ & 1);
    }
    else {
      if (((arrow_hit_x1._2_1_ & 1) != 0) && ((flags & 8U) == 0)) {
        TreePushOverrideID(id);
      }
      flags_local._3_1_ = (bool)(arrow_hit_x1._2_1_ & 1);
    }
  }
  else {
    flags_local._3_1_ = false;
  }
  return flags_local._3_1_;
}

Assistant:

bool ImGui::TreeNodeBehavior(ImGuiID id, ImGuiTreeNodeFlags flags, const char* label, const char* label_end)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const bool display_frame = (flags & ImGuiTreeNodeFlags_Framed) != 0;
    const ImVec2 padding = (display_frame || (flags & ImGuiTreeNodeFlags_FramePadding)) ? style.FramePadding : ImVec2(style.FramePadding.x, ImMin(window->DC.CurrLineTextBaseOffset, style.FramePadding.y));

    if (!label_end)
        label_end = FindRenderedTextEnd(label);
    const ImVec2 label_size = CalcTextSize(label, label_end, false);

    // We vertically grow up to current line height up the typical widget height.
    const float frame_height = ImMax(ImMin(window->DC.CurrLineSize.y, g.FontSize + style.FramePadding.y * 2), label_size.y + padding.y * 2);
    ImRect frame_bb;
    frame_bb.Min.x = (flags & ImGuiTreeNodeFlags_SpanFullWidth) ? window->WorkRect.Min.x : window->DC.CursorPos.x;
    frame_bb.Min.y = window->DC.CursorPos.y;
    frame_bb.Max.x = window->WorkRect.Max.x;
    frame_bb.Max.y = window->DC.CursorPos.y + frame_height;
    if (display_frame)
    {
        // Framed header expand a little outside the default padding, to the edge of InnerClipRect
        // (FIXME: May remove this at some point and make InnerClipRect align with WindowPadding.x instead of WindowPadding.x*0.5f)
        frame_bb.Min.x -= IM_FLOOR(window->WindowPadding.x * 0.5f - 1.0f);
        frame_bb.Max.x += IM_FLOOR(window->WindowPadding.x * 0.5f);
    }

    const float text_offset_x = g.FontSize + (display_frame ? padding.x * 3 : padding.x * 2);           // Collapser arrow width + Spacing
    const float text_offset_y = ImMax(padding.y, window->DC.CurrLineTextBaseOffset);                    // Latch before ItemSize changes it
    const float text_width = g.FontSize + (label_size.x > 0.0f ? label_size.x + padding.x * 2 : 0.0f);  // Include collapser
    ImVec2 text_pos(window->DC.CursorPos.x + text_offset_x, window->DC.CursorPos.y + text_offset_y);
    ItemSize(ImVec2(text_width, frame_height), padding.y);

    // For regular tree nodes, we arbitrary allow to click past 2 worth of ItemSpacing
    ImRect interact_bb = frame_bb;
    if (!display_frame && (flags & (ImGuiTreeNodeFlags_SpanAvailWidth | ImGuiTreeNodeFlags_SpanFullWidth)) == 0)
        interact_bb.Max.x = frame_bb.Min.x + text_width + style.ItemSpacing.x * 2.0f;

    // Store a flag for the current depth to tell if we will allow closing this node when navigating one of its child.
    // For this purpose we essentially compare if g.NavIdIsAlive went from 0 to 1 between TreeNode() and TreePop().
    // This is currently only support 32 level deep and we are fine with (1 << Depth) overflowing into a zero.
    const bool is_leaf = (flags & ImGuiTreeNodeFlags_Leaf) != 0;
    bool is_open = TreeNodeBehaviorIsOpen(id, flags);
    if (is_open && !g.NavIdIsAlive && (flags & ImGuiTreeNodeFlags_NavLeftJumpsBackHere) && !(flags & ImGuiTreeNodeFlags_NoTreePushOnOpen))
        window->DC.TreeJumpToParentOnPopMask |= (1 << window->DC.TreeDepth);

    bool item_add = ItemAdd(interact_bb, id);
    window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HasDisplayRect;
    window->DC.LastItemDisplayRect = frame_bb;

    if (!item_add)
    {
        if (is_open && !(flags & ImGuiTreeNodeFlags_NoTreePushOnOpen))
            TreePushOverrideID(id);
        IMGUI_TEST_ENGINE_ITEM_INFO(window->DC.LastItemId, label, window->DC.ItemFlags | (is_leaf ? 0 : ImGuiItemStatusFlags_Openable) | (is_open ? ImGuiItemStatusFlags_Opened : 0));
        return is_open;
    }

    ImGuiButtonFlags button_flags = ImGuiTreeNodeFlags_None;
    if (flags & ImGuiTreeNodeFlags_AllowItemOverlap)
        button_flags |= ImGuiButtonFlags_AllowItemOverlap;
    if (!is_leaf)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;

    // We allow clicking on the arrow section with keyboard modifiers held, in order to easily
    // allow browsing a tree while preserving selection with code implementing multi-selection patterns.
    // When clicking on the rest of the tree node we always disallow keyboard modifiers.
    const float arrow_hit_x1 = (text_pos.x - text_offset_x) - style.TouchExtraPadding.x;
    const float arrow_hit_x2 = (text_pos.x - text_offset_x) + (g.FontSize + padding.x * 2.0f) + style.TouchExtraPadding.x;
    const bool is_mouse_x_over_arrow = (g.IO.MousePos.x >= arrow_hit_x1 && g.IO.MousePos.x < arrow_hit_x2);
    if (window != g.HoveredWindow || !is_mouse_x_over_arrow)
        button_flags |= ImGuiButtonFlags_NoKeyModifiers;

    // Open behaviors can be altered with the _OpenOnArrow and _OnOnDoubleClick flags.
    // Some alteration have subtle effects (e.g. toggle on MouseUp vs MouseDown events) due to requirements for multi-selection and drag and drop support.
    // - Single-click on label = Toggle on MouseUp (default, when _OpenOnArrow=0)
    // - Single-click on arrow = Toggle on MouseDown (when _OpenOnArrow=0)
    // - Single-click on arrow = Toggle on MouseDown (when _OpenOnArrow=1)
    // - Double-click on label = Toggle on MouseDoubleClick (when _OpenOnDoubleClick=1)
    // - Double-click on arrow = Toggle on MouseDoubleClick (when _OpenOnDoubleClick=1 and _OpenOnArrow=0)
    // It is rather standard that arrow click react on Down rather than Up.
    // We set ImGuiButtonFlags_PressedOnClickRelease on OpenOnDoubleClick because we want the item to be active on the initial MouseDown in order for drag and drop to work.
    if (is_mouse_x_over_arrow)
        button_flags |= ImGuiButtonFlags_PressedOnClick;
    else if (flags & ImGuiTreeNodeFlags_OpenOnDoubleClick)
        button_flags |= ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnDoubleClick;
    else
        button_flags |= ImGuiButtonFlags_PressedOnClickRelease;

    bool selected = (flags & ImGuiTreeNodeFlags_Selected) != 0;
    const bool was_selected = selected;

    bool hovered, held;
    bool pressed = ButtonBehavior(interact_bb, id, &hovered, &held, button_flags);
    bool toggled = false;
    if (!is_leaf)
    {
        if (pressed && g.DragDropHoldJustPressedId != id)
        {
            if ((flags & (ImGuiTreeNodeFlags_OpenOnArrow | ImGuiTreeNodeFlags_OpenOnDoubleClick)) == 0 || (g.NavActivateId == id))
                toggled = true;
            if (flags & ImGuiTreeNodeFlags_OpenOnArrow)
                toggled |= is_mouse_x_over_arrow && !g.NavDisableMouseHover; // Lightweight equivalent of IsMouseHoveringRect() since ButtonBehavior() already did the job
            if ((flags & ImGuiTreeNodeFlags_OpenOnDoubleClick) && g.IO.MouseDoubleClicked[0])
                toggled = true;
        }
        else if (pressed && g.DragDropHoldJustPressedId == id)
        {
            IM_ASSERT(button_flags & ImGuiButtonFlags_PressedOnDragDropHold);
            if (!is_open) // When using Drag and Drop "hold to open" we keep the node highlighted after opening, but never close it again.
                toggled = true;
        }

        if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Left && is_open)
        {
            toggled = true;
            NavMoveRequestCancel();
        }
        if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Right && !is_open) // If there's something upcoming on the line we may want to give it the priority?
        {
            toggled = true;
            NavMoveRequestCancel();
        }

        if (toggled)
        {
            is_open = !is_open;
            window->DC.StateStorage->SetInt(id, is_open);
            window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_ToggledOpen;
        }
    }
    if (flags & ImGuiTreeNodeFlags_AllowItemOverlap)
        SetItemAllowOverlap();

    // In this branch, TreeNodeBehavior() cannot toggle the selection so this will never trigger.
    if (selected != was_selected) //-V547
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_ToggledSelection;

    // Render
    const ImU32 text_col = GetColorU32(ImGuiCol_Text);
    ImGuiNavHighlightFlags nav_highlight_flags = ImGuiNavHighlightFlags_TypeThin;
    if (display_frame)
    {
        // Framed type
        const ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
        RenderFrame(frame_bb.Min, frame_bb.Max, bg_col, true, style.FrameRounding);
        RenderNavHighlight(frame_bb, id, nav_highlight_flags);
        if (flags & ImGuiTreeNodeFlags_Bullet)
            RenderBullet(window->DrawList, ImVec2(text_pos.x - text_offset_x * 0.60f, text_pos.y + g.FontSize * 0.5f), text_col);
        else if (!is_leaf)
            RenderArrow(window->DrawList, ImVec2(text_pos.x - text_offset_x + padding.x, text_pos.y), text_col, is_open ? ImGuiDir_Down : ImGuiDir_Right, 1.0f);
        else // Leaf without bullet, left-adjusted text
            text_pos.x -= text_offset_x;
        if (flags & ImGuiTreeNodeFlags_ClipLabelForTrailingButton)
            frame_bb.Max.x -= g.FontSize + style.FramePadding.x;
        if (g.LogEnabled)
        {
            // NB: '##' is normally used to hide text (as a library-wide feature), so we need to specify the text range to make sure the ## aren't stripped out here.
            const char log_prefix[] = "\n##";
            const char log_suffix[] = "##";
            LogRenderedText(&text_pos, log_prefix, log_prefix + 3);
            RenderTextClipped(text_pos, frame_bb.Max, label, label_end, &label_size);
            LogRenderedText(&text_pos, log_suffix, log_suffix + 2);
        }
        else
        {
            RenderTextClipped(text_pos, frame_bb.Max, label, label_end, &label_size);
        }
    }
    else
    {
        // Unframed typed for tree nodes
        if (hovered || selected)
        {
            const ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
            RenderFrame(frame_bb.Min, frame_bb.Max, bg_col, false);
            RenderNavHighlight(frame_bb, id, nav_highlight_flags);
        }
        if (flags & ImGuiTreeNodeFlags_Bullet)
            RenderBullet(window->DrawList, ImVec2(text_pos.x - text_offset_x * 0.5f, text_pos.y + g.FontSize * 0.5f), text_col);
        else if (!is_leaf)
            RenderArrow(window->DrawList, ImVec2(text_pos.x - text_offset_x + padding.x, text_pos.y + g.FontSize * 0.15f), text_col, is_open ? ImGuiDir_Down : ImGuiDir_Right, 0.70f);
        if (g.LogEnabled)
            LogRenderedText(&text_pos, ">");
        RenderText(text_pos, label, label_end, false);
    }

    if (is_open && !(flags & ImGuiTreeNodeFlags_NoTreePushOnOpen))
        TreePushOverrideID(id);
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags | (is_leaf ? 0 : ImGuiItemStatusFlags_Openable) | (is_open ? ImGuiItemStatusFlags_Opened : 0));
    return is_open;
}